

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.h
# Opt level: O3

void __thiscall IRBuilderAsmJs::IRBuilderAsmJs(IRBuilderAsmJs *this,Func *func)

{
  bool bVar1;
  JITTimeFunctionBody *pJVar2;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *statementReader;
  AsmJsJITInfo *pAVar3;
  
  this->m_func = func;
  this->m_statementReader =
       (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
        *)0x0;
  this->m_jitLoopBodyData = (JitLoopBodyData *)0x0;
  (this->m_switchAdapter).super_SwitchAdapter._vptr_SwitchAdapter =
       (_func_int **)&PTR_AddBranchInstr_014d8808;
  (this->m_switchAdapter).m_builder = this;
  (this->m_switchBuilder).m_adapter = &(this->m_switchAdapter).super_SwitchAdapter;
  (this->m_switchBuilder).m_seenOnlySingleCharStrCaseNodes = true;
  (this->m_switchBuilder).m_profiledSwitchInstr = (Instr *)0x0;
  (this->m_switchBuilder).m_isAsmJs = false;
  (this->m_switchBuilder).m_switchOptBuildBail = false;
  (this->m_switchBuilder).m_switchIntDynProfile = false;
  (this->m_switchBuilder).m_switchStrDynProfile = false;
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  bVar1 = JITTimeFunctionBody::IsWasmFunction(pJVar2);
  if (bVar1) {
    statementReader = this->m_statementReader;
  }
  else {
    statementReader =
         (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          *)new<Memory::ArenaAllocator>(0x38,&func->m_alloc->super_ArenaAllocator,0x364470);
    (statementReader->m_statementMapIter).accumulatedIndex = 0;
    (statementReader->m_statementMapIter).accumulatedSourceBegin = 0;
    (statementReader->m_statementMapIter).accumulatedBytecodeBegin = 0;
    (statementReader->m_statementMapIter).indexOfActualOffset = 0;
    statementReader->m_fullstatementMap =
         (List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    statementReader->m_nextStatementBoundary = (byte *)0x0;
    statementReader->m_startLocation = (byte *)0x0;
    statementReader->m_statementMap = (SmallSpanSequence *)0x0;
    statementReader->m_statementIndex = 0;
    statementReader->m_startOfStatement = false;
    *(undefined3 *)&statementReader->field_0x35 = 0;
    (statementReader->m_statementMapIter).accumulatedIndex = -1;
    (statementReader->m_statementMapIter).accumulatedSourceBegin = 0;
    (statementReader->m_statementMapIter).accumulatedBytecodeBegin = 0;
    *(undefined8 *)&(statementReader->m_statementMapIter).indexOfActualOffset = 0;
    *(undefined8 *)((long)&statementReader->m_fullstatementMap + 4) = 0;
    *(undefined8 *)((long)&statementReader->m_nextStatementBoundary + 4) = 0;
    statementReader->m_startOfStatement = true;
    this->m_statementReader = statementReader;
  }
  JITTimeWorkItem::InitializeReader
            (func->m_workItem,&this->m_jnReader,statementReader,&func->m_alloc->super_ArenaAllocator
            );
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  pAVar3 = JITTimeFunctionBody::GetAsmJsInfo(pJVar2);
  this->m_asmFuncInfo = pAVar3;
  return;
}

Assistant:

IRBuilderAsmJs(Func * func)
        : m_func(func)
        , m_switchAdapter(this)
        , m_switchBuilder(&m_switchAdapter)
    {
        if (!m_func->GetJITFunctionBody()->IsWasmFunction())
        {
            m_statementReader = Anew(func->m_alloc, Js::StatementReader<Js::FunctionBody::ArenaStatementMapList>);
        }
        func->m_workItem->InitializeReader(&m_jnReader, m_statementReader, func->m_alloc);
        m_asmFuncInfo = m_func->GetJITFunctionBody()->GetAsmJsInfo();
#if 0
        // templatized JIT loop body
        if (func->IsLoopBody())
        {
            Js::LoopEntryPointInfo* loopEntryPointInfo = (Js::LoopEntryPointInfo*)(func->m_workItem->GetEntryPoint());
            if (loopEntryPointInfo->GetIsTJMode())
            {
                m_IsTJLoopBody = true;
                func->isTJLoopBody = true;
            }
        }
#endif
    }